

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

string * __thiscall
PacketProcessor::Encode(string *__return_storage_ptr__,PacketProcessor *this,string *rawstr)

{
  undefined1 uVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  undefined1 *puVar5;
  int local_60;
  int i_1;
  int local_4c;
  int ii;
  int i;
  int length;
  string str;
  string *rawstr_local;
  PacketProcessor *this_local;
  string *newstr;
  
  str.field_2._8_8_ = rawstr;
  if ((this->emulti_e == '\0') ||
     ((pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)rawstr), *pcVar4 == -1 &&
      (pcVar4 = (char *)std::__cxx11::string::operator[](str.field_2._8_8_), *pcVar4 == -1)))) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str.field_2._8_8_);
  }
  else {
    DickWinderE((string *)&length,this,(string *)str.field_2._8_8_);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    iVar3 = std::__cxx11::string::length();
    local_4c = 2;
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&length);
    uVar1 = *puVar5;
    puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *puVar5 = uVar1;
    puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&length);
    uVar1 = *puVar5;
    puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *puVar5 = uVar1;
    for (; local_4c < iVar3; local_4c = local_4c + 2) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&length);
      cVar2 = *pcVar4;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *pcVar4 = cVar2 + -0x80;
    }
    local_4c = iVar3 + -1;
    if (iVar3 % 2 != 0) {
      local_4c = iVar3 + -2;
    }
    for (; 1 < local_4c; local_4c = local_4c + -2) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&length);
      cVar2 = *pcVar4;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *pcVar4 = cVar2 + -0x80;
    }
    for (local_60 = 2; local_60 < iVar3; local_60 = local_60 + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      if (*pcVar4 == -0x80) {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        *puVar5 = 0;
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        if (*pcVar4 == '\0') {
          puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
          *puVar5 = 0x80;
        }
      }
    }
    std::__cxx11::string::~string((string *)&length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PacketProcessor::Encode(const std::string &rawstr)
{
	if (emulti_e == 0 || ((unsigned char)rawstr[2] == PACKET_A_INIT && (unsigned char)rawstr[3] == PACKET_F_INIT))
		return rawstr;

	std::string str = this->DickWinderE(rawstr);
	std::string newstr;
	int length = str.length();
	int i = 2;
	int ii = 2;

	newstr.resize(length);

	newstr[0] = str[0];
	newstr[1] = str[1];

	while (i < length)
	{
		newstr[i] = (unsigned char)str[ii++] ^ 0x80;
		i += 2;
	}

	i = length - 1;

	if (length % 2)
	{
		--i;
	}

	while (i >= 2)
	{
		newstr[i] = (unsigned char)str[ii++] ^ 0x80;
		i -= 2;
	}

	for (int i = 2; i < length; ++i)
	{
		if (static_cast<unsigned char>(newstr[i]) == 128)
		{
			newstr[i] = 0;
		}
		else if (newstr[i] == 0)
		{
			newstr[i] = 128;
		}
	}

	return newstr;
}